

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O3

void __thiscall
solitaire::piles::FoundationPileWithTwoTest_isSnapshotOfSameObject_Test::TestBody
          (FoundationPileWithTwoTest_isSnapshotOfSameObject_Test *this)

{
  byte bVar1;
  char *in_R9;
  pointer *__ptr;
  SnapshotMock snapshotOfDifferentTypeObject;
  AssertHelper AStack_118;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  internal local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  long *local_f8;
  string local_f0;
  long *local_d0;
  long *local_c8;
  undefined **local_c0;
  UntypedFunctionMockerBase local_b8;
  UntypedFunctionMockerBase local_70;
  
  (*(((this->super_FoundationPileWithTwoTest).super_FoundationPileWithAceTest.
      super_EmptyFoundationPileTest.pile.
      super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_FoundationPile).super_Archiver._vptr_Archiver[2])(&local_f8);
  (*(((this->super_FoundationPileWithTwoTest).super_FoundationPileWithAceTest.
      super_EmptyFoundationPileTest.pile.
      super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_FoundationPile).super_Archiver._vptr_Archiver[3])();
  (*(((this->super_FoundationPileWithTwoTest).super_FoundationPileWithAceTest.
      super_EmptyFoundationPileTest.pile.
      super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_FoundationPile).super_Archiver._vptr_Archiver[2])(&local_c8);
  std::__shared_ptr<solitaire::piles::FoundationPile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<solitaire::piles::FoundationPile>>
            ((__shared_ptr<solitaire::piles::FoundationPile,(__gnu_cxx::_Lock_policy)2> *)&local_c0,
             (allocator<solitaire::piles::FoundationPile> *)&local_f0);
  (**(code **)(*local_c0 + 0x10))(&local_d0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._vptr_UntypedFunctionMockerBase !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_b8._vptr_UntypedFunctionMockerBase);
  }
  local_c0 = &PTR__SnapshotMock_0031c8f0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase(&local_b8);
  local_b8._vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00318328;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase(&local_70);
  local_70._vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_0031c920;
  local_108[0] = (internal)(**(code **)(*local_f8 + 0x18))(local_f8,local_c8);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,local_108,
               (AssertionResult *)"snapshot->isSnapshotOfSameObject(*snapshotOfSameObject)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0xae,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&AStack_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
    if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,local_100);
    }
  }
  bVar1 = (**(code **)(*local_f8 + 0x18))(local_f8,local_d0);
  local_108[0] = (internal)(bVar1 ^ 1);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,local_108,
               (AssertionResult *)"snapshot->isSnapshotOfSameObject(*snapshotOfSameTypeObject)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0xaf,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&AStack_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
    if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,local_100);
    }
  }
  bVar1 = (**(code **)(*local_f8 + 0x18))(local_f8,&local_c0);
  local_108[0] = (internal)(bVar1 ^ 1);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,local_108,
               (AssertionResult *)"snapshot->isSnapshotOfSameObject(snapshotOfDifferentTypeObject)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0xb0,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&AStack_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
    if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,local_100);
    }
  }
  local_c0 = &PTR__SnapshotMock_0031c8f0;
  testing::internal::FunctionMocker<bool_(const_solitaire::archivers::interfaces::Snapshot_&)>::
  ~FunctionMocker((FunctionMocker<bool_(const_solitaire::archivers::interfaces::Snapshot_&)> *)
                  &local_70);
  testing::internal::FunctionMocker<void_()>::~FunctionMocker((FunctionMocker<void_()> *)&local_b8);
  if (local_d0 != (long *)0x0) {
    (**(code **)(*local_d0 + 8))();
  }
  if (local_c8 != (long *)0x0) {
    (**(code **)(*local_c8 + 8))();
  }
  if (local_f8 != (long *)0x0) {
    (**(code **)(*local_f8 + 8))();
  }
  return;
}

Assistant:

TEST_F(FoundationPileWithTwoTest, isSnapshotOfSameObject) {
    const auto snapshot = pile->createSnapshot();
    pile->initialize();
    const auto snapshotOfSameObject = pile->createSnapshot();
    const auto snapshotOfSameTypeObject = std::make_shared<FoundationPile>()->createSnapshot();
    SnapshotMock snapshotOfDifferentTypeObject;

    EXPECT_TRUE(snapshot->isSnapshotOfSameObject(*snapshotOfSameObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(*snapshotOfSameTypeObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(snapshotOfDifferentTypeObject));
}